

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_tiledesc(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  long in_RSI;
  long in_RDI;
  uint32_t sizes [2];
  exr_result_t rv;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffec;
  
  uVar2 = **(undefined4 **)(in_RSI + 0x18);
  eVar1 = save_attr_sz((_internal_exr_context *)
                       CONCAT44(in_stack_ffffffffffffffec,
                                *(undefined4 *)(*(long *)(in_RSI + 0x18) + 4)),
                       CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  if (eVar1 == 0) {
    eVar1 = save_attr_32((_internal_exr_context *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8,0);
  }
  if (eVar1 == 0) {
    eVar1 = (**(code **)(in_RDI + 0x30))(in_RDI,*(long *)(in_RSI + 0x18) + 8,1,in_RDI + 0xb0);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_tiledesc (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    uint32_t     sizes[2];

    sizes[0] = a->tiledesc->x_size;
    sizes[1] = a->tiledesc->y_size;

    rv = save_attr_sz (ctxt, sizeof (uint32_t) * 2 + 1);

    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, sizes, 2);
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt,
            &(a->tiledesc->level_and_round),
            sizeof (uint8_t),
            &(ctxt->output_file_offset));
    return rv;
}